

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dired.c
# Opt level: O1

int d_updirectory(int f,int n)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  buffer *bp;
  char local_418 [8];
  char fname [1024];
  
  uVar1 = snprintf(local_418,0x400,"%s..",curbp->b_fname);
  iVar3 = 2;
  if (uVar1 < 0x400) {
    bp = dired_(local_418);
    if (bp == (buffer *)0x0) {
      iVar3 = 0;
    }
    else {
      curbp = bp;
      iVar2 = showbuffer(bp,curwp,8);
      iVar3 = 0;
      if ((iVar2 == 1) && (iVar3 = 1, bp->b_fname[0] == '\0')) {
        iVar3 = readin(local_418);
      }
    }
  }
  return iVar3;
}

Assistant:

int
d_updirectory(int f, int n)
{
	struct buffer	*bp;
	int		 ret;
	char		 fname[NFILEN];

	ret = snprintf(fname, sizeof(fname), "%s..", curbp->b_fname);
	if (ret < 0 || (size_t)ret >= sizeof(fname))
		return (ABORT); /* Name is too long. */

	bp = dired_(fname);
	if (bp == NULL)
		return (FALSE);
	curbp = bp;
	if (showbuffer(bp, curwp, WFFULL) != TRUE)
		return (FALSE);
	if (bp->b_fname[0] != 0)
		return (TRUE);
	return (readin(fname));
}